

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorSorting.cpp
# Opt level: O1

double strToDouble(string *str,char ch)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  double dVar2;
  char local_9;
  
  _Var1._M_current = (str->_M_dataplus)._M_p;
  local_9 = ch;
  _Var1 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var1,_Var1._M_current + str->_M_string_length,&local_9);
  str->_M_string_length = (long)_Var1._M_current - (long)(str->_M_dataplus)._M_p;
  *_Var1._M_current = '\0';
  dVar2 = atof((str->_M_dataplus)._M_p);
  return dVar2;
}

Assistant:

double strToDouble(string str, char ch) {
    str.erase(remove(str.begin(), str.end(), ch), str.end());
    return atof(str.c_str());
}